

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

ImDrawFlags ImGui::CalcRoundingFlagsForRectInRect(ImRect *r_in,ImRect *r_outer,float threshold)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  bool round_b;
  bool round_t;
  bool round_r;
  bool round_l;
  float threshold_local;
  ImRect *r_outer_local;
  ImRect *r_in_local;
  
  bVar1 = (r_in->Min).x <= (r_outer->Min).x + threshold;
  bVar2 = (r_outer->Max).x - threshold <= (r_in->Max).x;
  bVar3 = (r_in->Min).y <= (r_outer->Min).y + threshold;
  bVar4 = (r_outer->Max).y - threshold <= (r_in->Max).y;
  uVar5 = 0;
  if (bVar3 && bVar1) {
    uVar5 = 0x10;
  }
  uVar6 = 0;
  if (bVar3 && bVar2) {
    uVar6 = 0x20;
  }
  uVar7 = 0;
  if (bVar4 && bVar1) {
    uVar7 = 0x40;
  }
  uVar8 = 0;
  if (bVar4 && bVar2) {
    uVar8 = 0x80;
  }
  return uVar5 | 0x100 | uVar6 | uVar7 | uVar8;
}

Assistant:

ImDrawFlags ImGui::CalcRoundingFlagsForRectInRect(const ImRect& r_in, const ImRect& r_outer, float threshold)
{
    bool round_l = r_in.Min.x <= r_outer.Min.x + threshold;
    bool round_r = r_in.Max.x >= r_outer.Max.x - threshold;
    bool round_t = r_in.Min.y <= r_outer.Min.y + threshold;
    bool round_b = r_in.Max.y >= r_outer.Max.y - threshold;
    return ImDrawFlags_RoundCornersNone
        | ((round_t && round_l) ? ImDrawFlags_RoundCornersTopLeft : 0) | ((round_t && round_r) ? ImDrawFlags_RoundCornersTopRight : 0)
        | ((round_b && round_l) ? ImDrawFlags_RoundCornersBottomLeft : 0) | ((round_b && round_r) ? ImDrawFlags_RoundCornersBottomRight : 0);
}